

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basic_endec.hxx
# Opt level: O0

back_insert_iterator<std::deque<char,_std::allocator<char>_>_> __thiscall
cryptox::
evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
::update<char_const*,std::back_insert_iterator<std::deque<char,std::allocator<char>>>>
          (evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,&EVP_DecryptInit_ex,&EVP_DecryptUpdate,&EVP_DecryptFinal_ex>
           *this,char *first,char *last,
          back_insert_iterator<std::deque<char,_std::allocator<char>_>_> d_first)

{
  int iVar1;
  int local_874;
  ulong uStack_870;
  int o_sz;
  size_t i_sz;
  uint8_t output [1056];
  uint8_t input [1024];
  back_insert_iterator<std::deque<char,_std::allocator<char>_>_> local_40;
  back_insert_iterator<std::deque<char,_std::allocator<char>_>_> oitr;
  char *itr;
  char *last_local;
  char *first_local;
  evp_cipher_context<cryptox::symmetric_algorithm<&EVP_aes_256_cbc>,_&EVP_DecryptInit_ex,_&EVP_DecryptUpdate,_&EVP_DecryptFinal_ex>
  *this_local;
  back_insert_iterator<std::deque<char,_std::allocator<char>_>_> d_first_local;
  
  local_40.container = d_first.container;
  oitr.container = (deque<char,_std::allocator<char>_> *)first;
  while( true ) {
    if (oitr.container == (deque<char,_std::allocator<char>_> *)last) {
      return (back_insert_iterator<std::deque<char,_std::allocator<char>_>_>)
             (back_insert_iterator<std::deque<char,_std::allocator<char>_>_>)local_40.container;
    }
    uStack_870 = 0;
    local_874 = 0;
    for (; uStack_870 < 0x400 && oitr.container != (deque<char,_std::allocator<char>_> *)last;
        oitr.container =
             (deque<char,_std::allocator<char>_> *)
             &((oitr.container)->super__Deque_base<char,_std::allocator<char>_>)._M_impl.field_0x1)
    {
      *(_Tp_alloc_type *)(output + uStack_870 + 0x418) =
           ((oitr.container)->super__Deque_base<char,_std::allocator<char>_>)._M_impl.
           super__Tp_alloc_type;
      uStack_870 = uStack_870 + 1;
    }
    iVar1 = EVP_DecryptUpdate(*(EVP_CIPHER_CTX **)this,(uchar *)&i_sz,&local_874,output + 0x418,
                              (int)uStack_870);
    if (iVar1 != 1) break;
    local_40 = std::
               copy<unsigned_char*,std::back_insert_iterator<std::deque<char,std::allocator<char>>>>
                         ((uchar *)&i_sz,output + (long)local_874 + -8,local_40);
    *(ulong *)(this + 0x10) = uStack_870 + *(long *)(this + 0x10);
    *(long *)(this + 0x18) = (long)local_874 + *(long *)(this + 0x18);
  }
  return (back_insert_iterator<std::deque<char,_std::allocator<char>_>_>)
         (back_insert_iterator<std::deque<char,_std::allocator<char>_>_>)d_first.container;
}

Assistant:

Output update(Input first, Input last, Output d_first) {
			Input   itr = first;
			Output oitr = d_first;

			while (itr != last) {
				std::uint8_t input[1024];
				std::uint8_t output[1024 + EVP_MAX_BLOCK_LENGTH];

				size_t i_sz = 0;
				int    o_sz = 0;

				while (i_sz < sizeof(input) && itr != last)
					input[i_sz++] = *itr++;

				if (UpdateFx(_context, output, &o_sz, input, i_sz) != 1)
					return d_first;

				oitr = std::copy(output, output + o_sz, oitr);

				_total_input += i_sz;
				_total_output += o_sz;
			}

			return oitr;
		}